

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

void __thiscall
ADPlanner::Update_SearchSuccs_of_ChangedEdges
          (ADPlanner *this,vector<int,_std::allocator<int>_> *statesIDV)

{
  pointer piVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference ppiVar5;
  long lVar6;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  ADState *searchstateinfo;
  CMDPSTATE *state;
  int stateID;
  int pind;
  int numofstatesaffected;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar7;
  int local_18;
  int local_14;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  sVar3 = std::vector<int_*,_std::allocator<int_*>_>::size
                    ((vector<int_*,_std::allocator<int_*>_> *)
                     ((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish + 2));
  if (sVar3 / 10 < sVar2) {
    *(undefined1 *)
     ((long)in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start + 0x51) = 1;
  }
  piVar1 = in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  *(short *)(piVar1 + 8) = (short)piVar1[8] + 1;
  *(undefined1 *)
   ((long)in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start + 0x52) = 1;
  *(undefined1 *)
   (in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
   + 0x14) = 1;
  local_14 = 0;
  local_18 = 0;
  while (iVar7 = local_18, sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI),
        iVar7 < (int)sVar2) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::at
                       (in_RDI,CONCAT44(iVar7,in_stack_ffffffffffffffb8));
    iVar7 = *pvVar4;
    ppiVar5 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                        ((vector<int_*,_std::allocator<int_*>_> *)
                         ((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish + 2),(long)iVar7);
    if (**ppiVar5 != -1) {
      lVar6 = (**(code **)((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + 0x32))
                        (in_RDI,iVar7,
                         in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      lVar6 = *(long *)(lVar6 + 0x38);
      if ((iVar7 != **(int **)(in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + 0xc)) &&
         (*(short *)(lVar6 + 0x2a) ==
          *(short *)((long)in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x22))) {
        (**(code **)((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start + 0x46))(in_RDI,lVar6);
        (**(code **)((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start + 0x44))(in_RDI,lVar6);
        local_14 = local_14 + 1;
      }
    }
    local_18 = local_18 + 1;
  }
  if (0 < local_14) {
    *(pointer *)
     in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    piVar1 = in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    piVar1[2] = 0;
    piVar1[3] = 0x41cdcd65;
  }
  return;
}

Assistant:

void ADPlanner::Update_SearchSuccs_of_ChangedEdges(vector<int> const * statesIDV)
{
    SBPL_PRINTF("updating %d affected states\n", (unsigned int)statesIDV->size());

    if (statesIDV->size() > environment_->StateID2IndexMapping.size() / 10) {
        SBPL_PRINTF("skipping affected states and instead restarting planner from scratch\n");
        pSearchStateSpace_->bReinitializeSearchStateSpace = true;
    }

    //it will be a new search iteration
    pSearchStateSpace_->searchiteration++;

    //will need to rebuild open list
    pSearchStateSpace_->bRebuildOpenList = true;

    //recompute heuristic for the heap
    pSearchStateSpace_->bReevaluatefvals = true;

    int numofstatesaffected = 0;
    for (int pind = 0; pind < (int)statesIDV->size(); pind++) {
        int stateID = statesIDV->at(pind);

        //first check that the state exists (to avoid creation of additional states)
        if (environment_->StateID2IndexMapping[stateID][ADMDP_STATEID2IND] == -1) continue;

        //now get the state
        CMDPSTATE* state = GetState(stateID, pSearchStateSpace_);
        ADState* searchstateinfo = (ADState*)state->PlannerSpecificData;

        //now check that the state is not start state and was created after last search reset
        if (stateID != pSearchStateSpace_->searchstartstate->StateID &&
            searchstateinfo->callnumberaccessed == pSearchStateSpace_->callnumber)
        {
#if DEBUG
            SBPL_FPRINTF(fDeb, "updating affected state %d:\n", stateID);
            PrintSearchState(searchstateinfo, fDeb);
            SBPL_FPRINTF(fDeb, "\n");
#endif

            //now we really do need to update it
            Recomputegval(searchstateinfo);
            UpdateSetMembership(searchstateinfo);
            numofstatesaffected++;

#if DEBUG
            SBPL_FPRINTF(fDeb, "the state %d after update\n", stateID);
            PrintSearchState(searchstateinfo, fDeb);
            SBPL_FPRINTF(fDeb, "\n");
#endif
        }
    }

    //TODO - check. I believe that there are cases when number of states
    //generated is drastically smaller than the number of states really
    //affected, which is a bug!
    SBPL_PRINTF("%d states really affected (%d states generated total so far)\n", numofstatesaffected,
                (int)environment_->StateID2IndexMapping.size());

    //reset eps for which we know a path was computed
    if (numofstatesaffected > 0) {
        //make sure eps is reset appropriately
        pSearchStateSpace_->eps = this->finitial_eps;

        //reset the satisfied eps
        pSearchStateSpace_->eps_satisfied = INFINITECOST;
    }
}